

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_wfopen(FILE **ppFile,wchar_t *pFilePath,wchar_t *pOpenMode,
                   ma_allocation_callbacks *pAllocationCallbacks)

{
  long lVar1;
  ma_result mVar2;
  size_t sVar3;
  char *__dst;
  int *piVar4;
  long lVar5;
  FILE *pFVar6;
  wchar_t wVar7;
  wchar_t *pFilePathTemp;
  mbstate_t mbs;
  char pOpenModeMB [32];
  wchar_t *local_68;
  mbstate_t local_60;
  char local_58 [40];
  
  if (ppFile == (FILE **)0x0) {
    return MA_INVALID_ARGS;
  }
  *ppFile = (FILE *)0x0;
  if (pOpenMode == (wchar_t *)0x0 || pFilePath == (wchar_t *)0x0) {
    return MA_INVALID_ARGS;
  }
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[0x18] = '\0';
  local_58[0x19] = '\0';
  local_58[0x1a] = '\0';
  local_58[0x1b] = '\0';
  local_58[0x1c] = '\0';
  local_58[0x1d] = '\0';
  local_58[0x1e] = '\0';
  local_58[0x1f] = '\0';
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_60.__count = 0;
  local_60.__value = (_union_27)0x0;
  local_68 = pFilePath;
  sVar3 = wcsrtombs((char *)0x0,&local_68,0,&local_60);
  if (sVar3 == 0xffffffffffffffff) {
    piVar4 = __errno_location();
    mVar2 = ma_result_from_errno(*piVar4);
    return mVar2;
  }
  sVar3 = sVar3 + 1;
  if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
    __dst = (char *)malloc(sVar3);
  }
  else {
    if (pAllocationCallbacks->onMalloc == (_func_void_ptr_size_t_void_ptr *)0x0) {
      return MA_OUT_OF_MEMORY;
    }
    __dst = (char *)(*pAllocationCallbacks->onMalloc)(sVar3,pAllocationCallbacks->pUserData);
  }
  if (__dst == (char *)0x0) {
    return MA_OUT_OF_MEMORY;
  }
  local_60.__count = 0;
  local_60.__value = (_union_27)0x0;
  local_68 = pFilePath;
  wcsrtombs(__dst,&local_68,sVar3,&local_60);
  lVar5 = 0;
  wVar7 = *pOpenMode;
  while (wVar7 != L'\0') {
    local_58[lVar5] = (char)wVar7;
    lVar1 = lVar5 + 1;
    lVar5 = lVar5 + 1;
    wVar7 = pOpenMode[lVar1];
  }
  local_58[lVar5] = '\0';
  pFVar6 = fopen(__dst,local_58);
  *ppFile = (FILE *)pFVar6;
  if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
    free(__dst);
  }
  else if (pAllocationCallbacks->onFree != (_func_void_void_ptr_void_ptr *)0x0) {
    (*pAllocationCallbacks->onFree)(__dst,pAllocationCallbacks->pUserData);
  }
  return -(uint)(*ppFile == (FILE *)0x0);
}

Assistant:

MA_API ma_result ma_wfopen(FILE** ppFile, const wchar_t* pFilePath, const wchar_t* pOpenMode, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (ppFile != NULL) {
        *ppFile = NULL;  /* Safety. */
    }

    if (pFilePath == NULL || pOpenMode == NULL || ppFile == NULL) {
        return MA_INVALID_ARGS;
    }

#if defined(MA_HAS_WFOPEN)
    {
        /* Use _wfopen() on Windows. */
    #if defined(_MSC_VER) && _MSC_VER >= 1400
        errno_t err = _wfopen_s(ppFile, pFilePath, pOpenMode);
        if (err != 0) {
            return ma_result_from_errno(err);
        }
    #else
        *ppFile = _wfopen(pFilePath, pOpenMode);
        if (*ppFile == NULL) {
            return ma_result_from_errno(errno);
        }
    #endif
        (void)pAllocationCallbacks;
    }
#else
    /*
    Use fopen() on anything other than Windows. Requires a conversion. This is annoying because fopen() is locale specific. The only real way I can
    think of to do this is with wcsrtombs(). Note that wcstombs() is apparently not thread-safe because it uses a static global mbstate_t object for
    maintaining state. I've checked this with -std=c89 and it works, but if somebody get's a compiler error I'll look into improving compatibility.
    */
    {
        mbstate_t mbs;
        size_t lenMB;
        const wchar_t* pFilePathTemp = pFilePath;
        char* pFilePathMB = NULL;
        char pOpenModeMB[32] = {0};

        /* Get the length first. */
        MA_ZERO_OBJECT(&mbs);
        lenMB = wcsrtombs(NULL, &pFilePathTemp, 0, &mbs);
        if (lenMB == (size_t)-1) {
            return ma_result_from_errno(errno);
        }

        pFilePathMB = (char*)ma_malloc(lenMB + 1, pAllocationCallbacks);
        if (pFilePathMB == NULL) {
            return MA_OUT_OF_MEMORY;
        }

        pFilePathTemp = pFilePath;
        MA_ZERO_OBJECT(&mbs);
        wcsrtombs(pFilePathMB, &pFilePathTemp, lenMB + 1, &mbs);

        /* The open mode should always consist of ASCII characters so we should be able to do a trivial conversion. */
        {
            size_t i = 0;
            for (;;) {
                if (pOpenMode[i] == 0) {
                    pOpenModeMB[i] = '\0';
                    break;
                }

                pOpenModeMB[i] = (char)pOpenMode[i];
                i += 1;
            }
        }

        *ppFile = fopen(pFilePathMB, pOpenModeMB);

        ma_free(pFilePathMB, pAllocationCallbacks);
    }

    if (*ppFile == NULL) {
        return MA_ERROR;
    }
#endif

    return MA_SUCCESS;
}